

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

bool helics::checkUnitMatch(string *unit1,string *unit2,bool strict_match)

{
  __type _Var1;
  bool bVar2;
  uint64_t uVar3;
  bool bVar4;
  unit_data uVar5;
  unit_data uVar6;
  double dVar7;
  precise_unit pVar8;
  precise_unit pVar9;
  precise_unit u2;
  precise_unit u1;
  precise_unit local_80;
  precise_unit local_70;
  string local_60;
  string local_40;
  
  bVar4 = true;
  if (((((unit1->_M_string_length != 0) &&
        (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)unit1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)unit2), !_Var1)) &&
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )unit1,"def"), !bVar2)) &&
      ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )unit1,"any"), !bVar2 && (unit2->_M_string_length != 0)))) &&
     ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit2,"def"), !bVar2 &&
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit2,"any"), !bVar2)))) {
    std::__cxx11::string::string
              ((string *)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit1);
    uVar3 = ::units::getDefaultFlags();
    pVar8 = ::units::unit_from_string(&local_40,uVar3);
    local_70 = pVar8;
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string
              ((string *)&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit2);
    uVar3 = ::units::getDefaultFlags();
    pVar9 = ::units::unit_from_string(&local_60,uVar3);
    local_80 = pVar9;
    std::__cxx11::string::~string((string *)&local_60);
    uVar6 = pVar8.base_units_;
    if ((uVar6 != (unit_data)0xfa94a488 || !NAN(pVar8.multiplier_)) &&
       (uVar5 = pVar9.base_units_, uVar5 != (unit_data)0xfa94a488 || !NAN(pVar9.multiplier_))) {
      if (strict_match) {
        return !NAN(pVar8.multiplier_ / pVar9.multiplier_) &&
               (-1 < (int)((uint)uVar5 | (uint)uVar6) && uVar5 == uVar6);
      }
      dVar7 = ::units::convert<units::precise_unit,units::precise_unit>(&local_70,&local_80);
      return !NAN(dVar7);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool checkUnitMatch(const std::string& unit1, const std::string& unit2, bool strict_match)
{
    if ((unit1.empty()) || (unit1 == unit2) || (unit1 == "def") || (unit1 == "any")) {
        return true;
    }

    if ((unit2.empty()) || (unit2 == "def") || (unit2 == "any")) {
        return true;
    }
    auto u1 = units::unit_from_string(unit1);
    auto u2 = units::unit_from_string(unit2);

    if (!units::is_valid(u1) || !units::is_valid(u2)) {
        return false;
    }
    if (strict_match) {
        double conv = units::quick_convert(u1, u2);
        return (!std::isnan(conv));
    }
    double conv = units::convert(u1, u2);
    return (!std::isnan(conv));
}